

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  array<vec<4UL,_double>,_3UL> pts;
  vec3f eye;
  vec3f center;
  vec3f up;
  long lVar2;
  size_t sVar3;
  long lVar4;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  double *pdVar5;
  int j;
  undefined8 *puVar6;
  mat4 *pmVar7;
  undefined8 *puVar8;
  size_t i;
  ulong uVar9;
  byte bVar10;
  vec<3UL,_double> ret;
  DepthBuffer zbuffer;
  TGAImage image;
  array<vec<4UL,_double>,_3UL> screen_coords;
  Model model;
  GouraudShader shader;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 in_stack_fffffffffffffb80 [24];
  vec4f local_468;
  string local_448;
  string local_428;
  pointer local_3f8;
  pointer in_stack_fffffffffffffc10;
  pointer in_stack_fffffffffffffc18;
  pointer in_stack_fffffffffffffc20;
  pointer in_stack_fffffffffffffc28;
  pointer in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  double in_stack_fffffffffffffc48;
  double in_stack_fffffffffffffc50;
  double local_3a8 [14];
  Model local_338;
  GouraudShader local_230;
  
  bVar10 = 0;
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"obj/african_head.obj","");
  Model::Model(&local_338,&local_428,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  vec<3UL,_double>::normalize(&light_dir);
  TGAImage::TGAImage((TGAImage *)&stack0xfffffffffffffc20,800,800,3);
  DepthBuffer::DepthBuffer((DepthBuffer *)&stack0xfffffffffffffbf8,800,800);
  pmVar7 = &local_230.super_IShader.uniform_ModelView;
  memset(pmVar7,0,0x180);
  local_230.super_IShader._vptr_IShader = (_func_int **)&PTR__IShader_00109d30;
  local_230.varying_tri.rows[0].x = 0.0;
  local_230.varying_tri.rows[0].y = 0.0;
  local_230.varying_tri.rows[0].z = 0.0;
  local_230.varying_tri.rows[1].x = 0.0;
  local_230.varying_tri.rows[1].y = 0.0;
  local_230.varying_tri.rows[1].z = 0.0;
  local_230.varying_tri.rows[2].x = 0.0;
  local_230.varying_tri.rows[2].y = 0.0;
  local_230.varying_tri.rows[2].z = 0.0;
  local_230.varying_ity.x = 0.0;
  local_230.varying_ity.y = 0.0;
  local_230.varying_ity.z = 0.0;
  local_230.uniform_light_dir.x = 0.0;
  local_230.uniform_light_dir.y = 0.0;
  local_230.uniform_light_dir.z = 0.0;
  eye.y = (double)in_stack_fffffffffffffc18;
  eye.x = (double)in_stack_fffffffffffffc10;
  eye.z = (double)in_stack_fffffffffffffc20;
  center.y = (double)in_stack_fffffffffffffc30;
  center.x = (double)in_stack_fffffffffffffc28;
  center.z = in_stack_fffffffffffffc38;
  up.y = in_stack_fffffffffffffc48;
  up.x = (double)in_stack_fffffffffffffc40;
  up.z = in_stack_fffffffffffffc50;
  dVar11 = ::eye.x;
  dVar12 = ::eye.y;
  dVar13 = ::eye.z;
  dVar14 = ::center.x;
  dVar15 = ::center.y;
  dVar16 = ::center.z;
  dVar17 = ::up.x;
  dVar18 = ::up.y;
  dVar19 = ::up.z;
  lookat(eye,center,up);
  pdVar5 = (double *)&stack0xfffffffffffffc48;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pmVar7->rows[0].data[0] = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar10 * -2 + 1;
    pmVar7 = (mat4 *)((long)pmVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  viewport(100,100,600,600);
  pdVar5 = (double *)&stack0xfffffffffffffc48;
  pmVar7 = &local_230.super_IShader.uniform_Viewport;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pmVar7->rows[0].data[0] = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar10 * -2 + 1;
    pmVar7 = (mat4 *)((long)pmVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  local_468.data[2] = ::eye.z;
  local_468.data[0] = ::eye.x;
  local_468.data[1] = ::eye.y;
  lVar4 = 3;
  do {
    dVar1 = vec<3UL,_double>::operator[](&::center,lVar4 - 1);
    lVar2 = (ulong)(lVar4 != 2) * 8 + 8;
    if (lVar4 == 1) {
      lVar2 = 0;
    }
    *(double *)((long)local_468.data + lVar2) = *(double *)((long)local_468.data + lVar2) - dVar1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  dVar1 = dot<3ul,double>((vec<3UL,_double> *)&local_468,(vec<3UL,_double> *)&local_468);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  projection(-1.0 / dVar1);
  pdVar5 = (double *)&stack0xfffffffffffffc48;
  pmVar7 = &local_230.super_IShader.uniform_Projection;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pmVar7->rows[0].data[0] = *pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar10 * -2 + 1;
    pmVar7 = (mat4 *)((long)pmVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  local_230.uniform_light_dir.x = light_dir.x;
  local_230.uniform_light_dir.y = light_dir.y;
  local_230.uniform_light_dir.z = light_dir.z;
  uVar9 = 0;
  while( true ) {
    pdVar5 = (double *)&stack0xfffffffffffffc48;
    sVar3 = Model::nfaces(&local_338);
    if (sVar3 <= uVar9) break;
    lVar4 = 0;
    do {
      GouraudShader::vertex(&local_468,&local_230,&local_338,(int)uVar9,(int)lVar4);
      pdVar5[2] = local_468.data[2];
      pdVar5[3] = local_468.data[3];
      *pdVar5 = local_468.data[0];
      pdVar5[1] = local_468.data[1];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 4;
    } while (lVar4 != 3);
    puVar6 = (undefined8 *)&stack0xfffffffffffffc48;
    puVar8 = (undefined8 *)&stack0xfffffffffffffb38;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar8 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    pts._M_elems[0].data[1] = dVar12;
    pts._M_elems[0].data[0] = dVar11;
    pts._M_elems[0].data[2] = dVar13;
    pts._M_elems[0].data[3] = dVar14;
    pts._M_elems[1].data[0] = dVar15;
    pts._M_elems[1].data[1] = dVar16;
    pts._M_elems[1].data[2] = dVar17;
    pts._M_elems[1].data[3] = dVar18;
    pts._M_elems[2].data[0] = dVar19;
    pts._M_elems[2].data[1] = (double)in_stack_fffffffffffffb80._0_8_;
    pts._M_elems[2].data[2] = (double)in_stack_fffffffffffffb80._8_8_;
    pts._M_elems[2].data[3] = (double)in_stack_fffffffffffffb80._16_8_;
    triangle(&local_338,pts,&local_230.super_IShader,(TGAImage *)&stack0xfffffffffffffc20,
             (DepthBuffer *)&stack0xfffffffffffffbf8);
    uVar9 = uVar9 + 1;
  }
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"output.tga","");
  __n = 1;
  TGAImage::write_tga_file((TGAImage *)&stack0xfffffffffffffc20,&local_448,true,true);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  DepthBuffer::write((DepthBuffer *)&stack0xfffffffffffffbf8,0x107050,__buf,__n);
  IShader::~IShader(&local_230.super_IShader);
  if (local_3f8 != (pointer)0x0) {
    operator_delete(local_3f8,(long)in_stack_fffffffffffffc18 - (long)local_3f8);
  }
  if (in_stack_fffffffffffffc20 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffc20,
                    (long)in_stack_fffffffffffffc30 - (long)in_stack_fffffffffffffc20);
  }
  Model::~Model(&local_338);
  return 0;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};

    light_dir.normalize();

    TGAImage image(width, height, TGAImage::RGB);
    DepthBuffer zbuffer(width, height);

    GouraudShader shader;
    shader.uniform_ModelView = lookat(eye, center, up);
    shader.uniform_Viewport = viewport(width / 8, height / 8, width * 3 / 4, height * 3 / 4);
    shader.uniform_Projection = projection(-1. / (eye - center).norm());
    shader.uniform_light_dir = light_dir;
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec4f, 3> screen_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = shader.vertex(model, i, j);
        }
        triangle(model, screen_coords, shader, image, zbuffer);
    }

    // image.flip_vertically();  // to place the origin in the bottom left corner of the image
    // zbuffer.flip_vertically();
    image.write_tga_file("output.tga");
    zbuffer.write("zbuffer.tga");

    return 0;
}